

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O0

void __thiscall
cmCommandArgumentParserHelper::cmCommandArgumentParserHelper(cmCommandArgumentParserHelper *this)

{
  cmCommandArgumentParserHelper *this_local;
  
  std::__cxx11::string::string((string *)&this->InputBuffer);
  std::vector<char,_std::allocator<char>_>::vector(&this->OutputBuffer);
  std::vector<char_*,_std::allocator<char_*>_>::vector(&this->Variables);
  std::__cxx11::string::string((string *)&this->Result);
  std::__cxx11::string::string((string *)&this->ErrorString);
  this->FileLine = -1;
  this->FileName = (char *)0x0;
  this->RemoveEmpty = true;
  this->NoEscapeMode = false;
  this->ReplaceAtSyntax = false;
  return;
}

Assistant:

cmCommandArgumentParserHelper::cmCommandArgumentParserHelper()
{
  this->FileLine = -1;
  this->FileName = nullptr;
  this->RemoveEmpty = true;

  this->NoEscapeMode = false;
  this->ReplaceAtSyntax = false;
}